

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbeContainer.cpp
# Opt level: O3

void __thiscall
Js::ProbeContainer::UpdateFramePointers
          (ProbeContainer *this,bool fMatchWithCurrentScriptContext,
          DWORD_PTR dispatchHaltFrameAddress)

{
  int iVar1;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_00;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 byteCodeOffset;
  ReferencedArenaAdapter *pRVar5;
  DiagStack *pDVar6;
  List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *this_01;
  InterpreterStackFrame *this_02;
  ScriptContext *this_03;
  void **ppvVar7;
  JavascriptFunction *pJVar8;
  ScriptFunction *function;
  void *codeAddr;
  PCWSTR displayName;
  DiagStackFrame *pDVar9;
  short sVar10;
  undefined7 in_register_00000031;
  undefined1 local_110 [8];
  JavascriptStackWalker walker;
  JavascriptFunction *local_60;
  void **local_58;
  ArenaAllocator *local_50;
  ProbeContainer *local_48;
  DiagNativeStackFrame *local_40;
  int local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000031,fMatchWithCurrentScriptContext);
  local_58 = (void **)dispatchHaltFrameAddress;
  local_48 = this;
  pRVar5 = DebugManager::GetDiagnosticArena(this->debugManager);
  local_50 = (ArenaAllocator *)0x0;
  if (pRVar5->deleteFlag == false) {
    local_50 = pRVar5->arena;
  }
  pDVar6 = (DiagStack *)new<Memory::ArenaAllocator>(0x30,local_50,0x364470);
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  alloc = local_50;
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d03b8;
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  buffer = (Type)0x0;
  (pDVar6->list).super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>.
  count = 0;
  (pDVar6->list).length = 0;
  (pDVar6->list).increment = 4;
  local_48->framePointers = pDVar6;
  JavascriptStackWalker::JavascriptStackWalker
            ((JavascriptStackWalker *)local_110,local_48->pScriptContext,(bool)((byte)local_34 ^ 1),
             (PVOID)0x0,true);
  this_01 = (List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)new<Memory::ArenaAllocator>(0x30,local_50,0x364470);
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).alloc
       = local_50;
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
  _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014d03b8;
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer = (Type)0x0;
  (this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
       = 0;
  this_01->length = 0;
  this_01->increment = 4;
  local_38 = (int)CONCAT71((int7)((ulong)local_50 >> 8),1);
  if (DAT_015b095d == '\0') {
    if (local_48->debuggerOptionsCallback == (DebuggerOptionsCallback *)0x0) {
      local_38 = 0;
    }
    else {
      local_38 = (*local_48->debuggerOptionsCallback->_vptr_DebuggerOptionsCallback[3])();
    }
  }
  BVar4 = JavascriptStackWalker::GetNonLibraryCodeCaller
                    ((JavascriptStackWalker *)local_110,&local_60);
  if (BVar4 != 0) {
    walker.currentFrame.stackCheckCodeHeight = __tls_get_addr(&PTR_01548f08);
    sVar10 = 0;
    do {
      bVar3 = JavascriptStackWalker::IsDisplayCaller(local_60);
      pJVar8 = local_60;
      if (bVar3) {
        if ((char)local_38 == '\0') {
          bVar3 = JavascriptFunction::IsLibraryCode(local_60);
          if (!bVar3) goto LAB_008c67e9;
        }
        else {
LAB_008c67e9:
          this_02 = JavascriptStackWalker::GetCurrentInterpreterFrame
                              ((JavascriptStackWalker *)local_110);
          this_03 = JavascriptStackWalker::GetCurrentScriptContext
                              ((JavascriptStackWalker *)local_110);
          if (this_03 == (ScriptContext *)0x0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *(undefined4 *)walker.currentFrame.stackCheckCodeHeight = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/ProbeContainer.cpp"
                                        ,0x74,"(frameScriptContext)","frameScriptContext");
            if (!bVar3) {
              pcVar2 = (code *)invalidInstructionException();
              (*pcVar2)();
            }
            *(undefined4 *)walker.currentFrame.stackCheckCodeHeight = 0;
          }
          if ((byte)local_34 == '\0') {
            bVar3 = ScriptContext::IsScriptContextInDebugMode(this_03);
            if ((!bVar3) &&
               ((this_01->
                super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
                count == 0)) break;
          }
          bVar3 = ScriptContext::IsScriptContextInDebugMode(this_03);
          if ((bVar3) && (((byte)local_34 == '\0' || (this_03 == local_48->pScriptContext)))) {
            if (this_02 == (InterpreterStackFrame *)0x0) {
              ppvVar7 = JavascriptStackWalker::GetCurrentArgv((JavascriptStackWalker *)local_110);
              if (local_58 != (void **)0x0 && ppvVar7 <= local_58) goto LAB_008c69da;
              BVar4 = JavascriptFunction::IsScriptFunction(pJVar8);
              if (BVar4 == 0) {
                local_40 = (DiagNativeStackFrame *)
                           new<Memory::ArenaAllocator>(0x28,local_50,0x364470);
                displayName = JavascriptStackWalker::GetCurrentNativeLibraryEntryName
                                        ((JavascriptStackWalker *)local_110);
                DiagRuntimeStackFrame::DiagRuntimeStackFrame
                          ((DiagRuntimeStackFrame *)local_40,pJVar8,displayName,ppvVar7);
              }
              else {
                local_40 = (DiagNativeStackFrame *)
                           new<Memory::ArenaAllocator>(0x30,local_50,0x364470);
                pJVar8 = JavascriptStackWalker::GetCurrentFunction
                                   ((JavascriptStackWalker *)local_110,true);
                function = VarTo<Js::ScriptFunction,Js::JavascriptFunction>(pJVar8);
                byteCodeOffset =
                     JavascriptStackWalker::GetByteCodeOffset((JavascriptStackWalker *)local_110);
                codeAddr = JavascriptStackWalker::GetCurrentCodeAddr
                                     ((JavascriptStackWalker *)local_110);
                DiagNativeStackFrame::DiagNativeStackFrame
                          (local_40,function,byteCodeOffset,ppvVar7,codeAddr);
              }
            }
            else {
              if (local_58 != (void **)0x0) {
                ppvVar7 = (void **)InterpreterStackFrame::GetStackAddress(this_02);
                if (ppvVar7 <= local_58) goto LAB_008c69da;
              }
              local_40 = (DiagNativeStackFrame *)new<Memory::ArenaAllocator>(0x18,local_50,0x364470)
              ;
              DiagInterpreterStackFrame::DiagInterpreterStackFrame
                        ((DiagInterpreterStackFrame *)local_40,this_02);
            }
            JsUtil::
            List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
            ::EnsureArray(this_01,0);
            iVar1 = (this_01->
                    super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                    ).count;
            (this_01->
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
            buffer[iVar1] = &local_40->super_DiagStackFrame;
            (this_01->
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
                 = iVar1 + 1;
          }
        }
LAB_008c69da:
        sVar10 = sVar10 + 1;
        if (sVar10 == -1) break;
      }
      BVar4 = JavascriptStackWalker::GetCaller((JavascriptStackWalker *)local_110,&local_60,true);
    } while (BVar4 != 0);
  }
  Output::Trace(DebuggerPhase,
                L"ProbeContainer::UpdateFramePointers: detected %d frames (this=%p, fMatchWithCurrentScriptContext=%d)\n"
                ,(ulong)(uint)(this_01->
                              super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
                              ).count,local_48,(ulong)(byte)local_34);
  while ((this_01->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>
         ).count != 0) {
    this_00 = &local_48->framePointers->list;
    pDVar9 = JsUtil::Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::
             Pop((Stack<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_DefaultComparer> *)
                 this_01);
    JsUtil::
    List<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::EnsureArray(this_00,0);
    iVar1 = (this_00->
            super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).count
    ;
    (this_00->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer[iVar1] = pDVar9;
    (this_00->super_ReadOnlyList<Js::DiagStackFrame_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = iVar1 + 1;
  }
  JavascriptStackWalker::~JavascriptStackWalker((JavascriptStackWalker *)local_110);
  return;
}

Assistant:

void ProbeContainer::UpdateFramePointers(bool fMatchWithCurrentScriptContext, DWORD_PTR dispatchHaltFrameAddress)
    {
        ArenaAllocator* pDiagArena = debugManager->GetDiagnosticArena()->Arena();
        framePointers = Anew(pDiagArena, DiagStack, pDiagArena);

        JavascriptStackWalker walker(pScriptContext, !fMatchWithCurrentScriptContext, nullptr/*returnAddress*/, true/*forceFullWalk*/);
        DiagStack* tempFramePointers = Anew(pDiagArena, DiagStack, pDiagArena);
        const bool isLibraryFrameEnabledDebugger = IsLibraryStackFrameSupportEnabled();

        walker.WalkUntil([&](JavascriptFunction* func, ushort frameIndex) -> bool
        {
            if (isLibraryFrameEnabledDebugger || !func->IsLibraryCode())
            {
                DiagStackFrame* frm = nullptr;
                InterpreterStackFrame *interpreterFrame = walker.GetCurrentInterpreterFrame();
                ScriptContext* frameScriptContext = walker.GetCurrentScriptContext();
                Assert(frameScriptContext);

                if (!fMatchWithCurrentScriptContext && !frameScriptContext->IsScriptContextInDebugMode() && tempFramePointers->Count() == 0)
                {
                    // this means the top frame is not in the debug mode. We shouldn't be stopping for this break.
                    // This could happen if the exception happens on the diagnosticsScriptEngine.
                    return true;
                }

                // Ignore frames which are not in debug mode, which can happen when diag engine calls into user engine under debugger
                // -- topmost frame is under debugger but some frames could be in non-debug mode as they are from diag engine.
                if (frameScriptContext->IsScriptContextInDebugMode() &&
                    (!fMatchWithCurrentScriptContext || frameScriptContext == pScriptContext))
                {
                    if (interpreterFrame)
                    {
                        if (dispatchHaltFrameAddress == 0 || interpreterFrame->GetStackAddress() > dispatchHaltFrameAddress)
                        {
                            frm = Anew(pDiagArena, DiagInterpreterStackFrame, interpreterFrame);
                        }
                    }
                    else
                    {
                        void* stackAddress = walker.GetCurrentArgv();
                        if (dispatchHaltFrameAddress == 0 || reinterpret_cast<DWORD_PTR>(stackAddress) > dispatchHaltFrameAddress)
                        {
#if ENABLE_NATIVE_CODEGEN
                            if (func->IsScriptFunction())
                            {
                                frm = Anew(pDiagArena, DiagNativeStackFrame,
                                    VarTo<ScriptFunction>(walker.GetCurrentFunction()), walker.GetByteCodeOffset(), stackAddress, walker.GetCurrentCodeAddr());
                            }
                            else
#else
                            Assert(!func->IsScriptFunction());
#endif
                            {
                                frm = Anew(pDiagArena, DiagRuntimeStackFrame, func, walker.GetCurrentNativeLibraryEntryName(), stackAddress);
                            }
                        }
                    }
                }

                if (frm)
                {
                    tempFramePointers->Push(frm);
                }
            }

            return false;
        });

        OUTPUT_TRACE(Js::DebuggerPhase, _u("ProbeContainer::UpdateFramePointers: detected %d frames (this=%p, fMatchWithCurrentScriptContext=%d)\n"),
            tempFramePointers->Count(), this, fMatchWithCurrentScriptContext);

        while (tempFramePointers->Count())
        {
            framePointers->Push(tempFramePointers->Pop());
        }
    }